

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O3

int process_opts(int argc,char **argv,nt_opts *opts)

{
  str_list *slist;
  str_list *slist_00;
  char cVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  ushort **ppuVar5;
  nt_opts *__s1;
  char *pcVar6;
  nt_opts *prog;
  long lVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  field_s nhdr_fields [47];
  uint local_964;
  field_s local_918 [63];
  
  uVar2 = (ulong)(uint)argc;
  prog = opts;
  memset(opts,0,0x900);
  opts->new_datatype = 4;
  opts->debug = 1;
  opts->new_dim[0] = 3;
  opts->new_dim[1] = 1;
  opts->new_dim[2] = 1;
  opts->new_dim[3] = 1;
  if (1 < argc) {
    slist = &opts->elist;
    slist_00 = &opts->infiles;
    uVar10 = 1;
    do {
      lVar7 = (long)(int)uVar10;
      __s1 = (nt_opts *)argv[lVar7];
      iVar3 = strncmp((char *)__s1,"-help_datatypes",9);
      if (iVar3 == 0) {
        if ((int)(uVar10 + 1) < argc) {
          switch((*argv[(int)(uVar10 + 1)] + 0xbcU) * '\x10' |
                 (byte)(*argv[(int)(uVar10 + 1)] + 0xbcU) >> 4) {
          case 0:
          case 2:
            nifti_disp_type_list(1);
            return 1;
          case 1:
          case 3:
            nifti_test_datatype_sizes(1);
            return 1;
          default:
            iVar3 = 2;
          }
        }
        else {
          iVar3 = 3;
        }
        nifti_disp_type_list(iVar3);
        return 1;
      }
      iVar3 = strncmp((char *)__s1,"-help_hdr",9);
      if (iVar3 == 0) {
        fill_hdr_field_array(local_918);
        pcVar6 = "nifti_1_header: ";
        iVar3 = 0x2b;
LAB_0010757a:
        disp_field_s_list(pcVar6,local_918,iVar3);
        return 1;
      }
      iVar3 = strncmp((char *)__s1,"-help_nim",9);
      if (iVar3 == 0) {
        fill_nim_field_array(local_918);
        pcVar6 = "nifti_image: ";
        iVar3 = 0x3f;
        goto LAB_0010757a;
      }
      iVar3 = strncmp((char *)__s1,"-help_ana",9);
      if (iVar3 == 0) {
        fill_ana_field_array(local_918);
        pcVar6 = "nifti_analyze75: ";
        iVar3 = 0x2f;
        goto LAB_0010757a;
      }
      prog = __s1;
      iVar3 = strncmp((char *)__s1,"-help",5);
      if (iVar3 == 0) break;
      iVar3 = strncmp((char *)__s1,"-hist",5);
      if (iVar3 == 0) {
        lVar7 = 0;
        do {
          fputs(*(char **)((long)g_history + lVar7),_stdout);
          lVar7 = lVar7 + 8;
        } while (lVar7 != 0xe8);
        return 1;
      }
      cVar1 = (char)__s1->check_hdr;
      if ((cVar1 == '-') && (*(char *)((long)&__s1->check_hdr + 1) == 'v')) {
        fprintf(_stdout,"%s, %s\n",*argv,g_version);
        return 1;
      }
      iVar3 = strncmp((char *)__s1,"-nifti_hist",0xb);
      if (iVar3 == 0) {
        nifti_disp_lib_hist();
        return 1;
      }
      iVar3 = strncmp((char *)__s1,"-nifti_ver",10);
      if (iVar3 == 0) {
        nifti_disp_lib_version();
        return 1;
      }
      iVar3 = strncmp((char *)__s1,"-with_zlib",5);
      if (iVar3 == 0) {
        iVar3 = nifti_compiled_with_zlib();
        pcVar6 = "YES";
        if (iVar3 == 0) {
          pcVar6 = "NO";
        }
        printf("Was NIfTI library compiled with zlib?  %s\n",pcVar6);
        return 1;
      }
      iVar3 = strncmp((char *)__s1,"-add_afni_ext",9);
      if (iVar3 == 0) {
        if (argc <= (int)(uVar10 + 1)) {
          process_opts_cold_13();
          return 1;
        }
        iVar3 = add_string(slist,argv[(int)(uVar10 + 1)]);
        if (iVar3 != 0) {
          return -1;
        }
        iVar3 = 4;
LAB_00106e02:
        uVar10 = uVar10 + 1;
        iVar3 = add_int(&opts->etypes,iVar3);
        if (iVar3 != 0) {
          return -1;
        }
        opts->add_exts = 1;
      }
      else {
        iVar3 = strncmp((char *)__s1,"-add_comment_ext",9);
        if (iVar3 == 0) {
          if (argc <= (int)(uVar10 + 1)) {
            process_opts_cold_12();
            return 1;
          }
          iVar3 = add_string(slist,argv[(int)(uVar10 + 1)]);
          if (iVar3 != 0) {
            return -1;
          }
          iVar3 = 6;
          goto LAB_00106e02;
        }
        iVar3 = strncmp((char *)__s1,"-check_hdr",10);
        if (iVar3 == 0) {
          opts->check_hdr = 1;
        }
        else {
          iVar3 = strncmp((char *)__s1,"-check_nim",10);
          if (iVar3 == 0) {
            opts->check_nim = 1;
          }
          else {
            iVar3 = strncmp((char *)__s1,"-copy_brick_list",0xb);
            if (((iVar3 == 0) || (iVar3 = strncmp((char *)__s1,"-copy_im",10), iVar3 == 0)) ||
               (iVar3 = strncmp((char *)__s1,"-cbl",4), iVar3 == 0)) {
              opts->cbl = 1;
            }
            else {
              iVar3 = strncmp((char *)__s1,"-copy_collapsed_image",10);
              if ((iVar3 == 0) || (iVar3 = strncmp((char *)__s1,"-cci",4), iVar3 == 0)) {
                opts->ci_dims[0] = 0;
                lVar9 = 0;
                do {
                  if ((long)uVar2 <= lVar7 + 1 + lVar9) {
                    process_opts_cold_11();
                    return 1;
                  }
                  ppuVar5 = __ctype_b_loc();
                  pcVar6 = argv[lVar7 + lVar9 + 1];
                  if (((*(byte *)((long)*ppuVar5 + (long)*pcVar6 * 2 + 1) & 8) == 0) &&
                     (((*pcVar6 != '-' || (pcVar6[1] != '1')) || (pcVar6[2] != '\0')))) {
                    uVar8 = (ulong)((int)lVar9 + 1);
                    pcVar6 = 
                    "** -cci param %d (= \'%s\') is not a valid\n   consider: \'nifti_tool -help\'\n"
                    ;
                    goto LAB_001076f9;
                  }
                  iVar3 = atoi(pcVar6);
                  opts->ci_dims[lVar9 + 1] = iVar3;
                  lVar9 = lVar9 + 1;
                } while (lVar9 != 7);
                uVar10 = uVar10 + 7;
                opts->cci = 1;
              }
              else {
                iVar3 = strncmp((char *)__s1,"-debug",6);
                if (iVar3 == 0) {
                  uVar10 = uVar10 + 1;
                  if (argc <= (int)uVar10) {
                    process_opts_cold_10();
                    return 1;
                  }
                  iVar3 = atoi(argv[(int)uVar10]);
                  opts->debug = iVar3;
                }
                else {
                  iVar3 = strncmp((char *)__s1,"-diff_hdr",8);
                  if (iVar3 == 0) {
                    opts->diff_hdr = 1;
                  }
                  else {
                    iVar3 = strncmp((char *)__s1,"-diff_nim",8);
                    if (iVar3 == 0) {
                      opts->diff_nim = 1;
                    }
                    else {
                      iVar3 = strncmp((char *)__s1,"-disp_exts",7);
                      if (iVar3 == 0) {
                        opts->disp_exts = 1;
                      }
                      else {
                        iVar3 = strncmp((char *)__s1,"-disp_hdr",8);
                        if (iVar3 == 0) {
                          opts->disp_hdr = 1;
                        }
                        else {
                          iVar3 = strncmp((char *)__s1,"-disp_nim",8);
                          if (iVar3 == 0) {
                            opts->disp_nim = 1;
                          }
                          else {
                            iVar3 = strncmp((char *)__s1,"-disp_ana",8);
                            if (iVar3 == 0) {
                              opts->disp_ana = 1;
                            }
                            else {
                              iVar3 = strncmp((char *)__s1,"-dci_lines",6);
                              if ((iVar3 == 0) ||
                                 (iVar3 = strncmp((char *)__s1,"-dts_lines",6), iVar3 == 0)) {
                                opts->dci_lines = 1;
                              }
                              else {
                                iVar3 = strncmp((char *)__s1,"-disp_collapsed_image",10);
                                if ((iVar3 == 0) ||
                                   (iVar3 = strncmp((char *)__s1,"-disp_ci",8), iVar3 == 0)) {
                                  opts->ci_dims[0] = 0;
                                  lVar9 = 0;
                                  do {
                                    if ((long)uVar2 <= lVar7 + 1 + lVar9) {
                                      process_opts_cold_9();
                                      return 1;
                                    }
                                    ppuVar5 = __ctype_b_loc();
                                    pcVar6 = argv[lVar7 + lVar9 + 1];
                                    if (((*(byte *)((long)*ppuVar5 + (long)*pcVar6 * 2 + 1) & 8) ==
                                         0) && (((*pcVar6 != '-' || (pcVar6[1] != '1')) ||
                                                (pcVar6[2] != '\0')))) {
                                      uVar8 = (ulong)((int)lVar9 + 1);
                                      pcVar6 = 
                                      "** -disp_ci param %d (= \'%s\') is not a valid\n   consider: \'nifti_tool -help\'\n"
                                      ;
                                      goto LAB_001076f9;
                                    }
                                    iVar3 = atoi(pcVar6);
                                    opts->ci_dims[lVar9 + 1] = iVar3;
                                    lVar9 = lVar9 + 1;
                                  } while (lVar9 != 7);
                                  uVar10 = uVar10 + 7;
                                  opts->dci = 1;
                                }
                                else {
                                  iVar3 = strncmp((char *)__s1,"-disp_ts",10);
                                  if ((iVar3 == 0) ||
                                     (iVar3 = strncmp((char *)__s1,"-dts",4), iVar3 == 0)) {
                                    lVar9 = 0;
                                    do {
                                      if ((long)uVar2 <= lVar7 + 1 + lVar9) {
                                        process_opts_cold_8();
                                        return 1;
                                      }
                                      ppuVar5 = __ctype_b_loc();
                                      if ((*(byte *)((long)*ppuVar5 +
                                                    (long)*argv[lVar7 + lVar9 + 1] * 2 + 1) & 8) ==
                                          0) {
                                        uVar8 = (ulong)((int)lVar9 + 1);
                                        pcVar6 = 
                                        "** -dts param %d (= \'%s\') is not a number\n   consider: \'nifti_tool -help\'\n"
                                        ;
                                        goto LAB_001076f9;
                                      }
                                      iVar3 = atoi(argv[lVar7 + lVar9 + 1]);
                                      opts->ci_dims[lVar9 + 1] = iVar3;
                                      lVar9 = lVar9 + 1;
                                    } while (lVar9 != 3);
                                    opts->ci_dims[0] = 0;
                                    opts->ci_dims[4] = -1;
                                    opts->ci_dims[5] = -1;
                                    opts->ci_dims[6] = -1;
                                    opts->ci_dims[7] = -1;
                                    uVar10 = uVar10 + 3;
                                    opts->dts = 1;
                                  }
                                  else if (cVar1 == '-') {
                                    if (*(char *)((long)&__s1->check_hdr + 1) == 'f') {
                                      uVar10 = uVar10 + 1;
                                      if (argc <= (int)uVar10) {
                                        process_opts_cold_7();
                                        return 1;
                                      }
                                      iVar3 = add_string(&opts->flist,argv[(int)uVar10]);
                                      if (iVar3 != 0) {
                                        return -1;
                                      }
                                    }
                                    else {
                                      if ((*(char *)((long)&__s1->check_hdr + 1) != 'i') ||
                                         (*(char *)((long)&__s1->check_hdr + 2) != 'n'))
                                      goto LAB_001070cc;
                                      uVar4 = uVar10 + 1;
                                      local_964 = 0;
                                      if ((int)uVar4 < argc) {
                                        lVar7 = (long)(int)uVar4;
                                        pcVar6 = argv[lVar7];
                                        local_964 = 0;
                                        if (*pcVar6 != '-') {
                                          local_964 = ~uVar10 + argc;
                                          lVar9 = 0;
                                          do {
                                            uVar11 = uVar10;
                                            iVar3 = add_string(slist_00,pcVar6);
                                            if (iVar3 != 0) {
                                              return -1;
                                            }
                                            uVar10 = argc;
                                            uVar4 = argc;
                                            if ((uVar2 - 1) - lVar7 == lVar9) goto LAB_001073f0;
                                            pcVar6 = argv[lVar7 + lVar9 + 1];
                                            uVar10 = uVar11 + 1;
                                            lVar9 = lVar9 + 1;
                                          } while (*pcVar6 != '-');
                                          local_964 = (uint)lVar9;
                                          uVar4 = uVar11 + 2;
                                        }
LAB_001073f0:
                                        if (local_964 != 0) {
                                          uVar4 = uVar10;
                                        }
                                      }
                                      uVar10 = uVar4;
                                      if (2 < g_debug) {
                                        fprintf(_stderr,"+d have %d file names\n",(ulong)local_964);
                                      }
                                    }
                                  }
                                  else {
LAB_001070cc:
                                    iVar3 = strncmp((char *)__s1,"-make_image",8);
                                    if (iVar3 == 0) {
                                      opts->make_im = 1;
                                    }
                                    else {
                                      iVar3 = strncmp((char *)__s1,"-mod_field",6);
                                      if (iVar3 == 0) {
                                        if (argc <= (int)(uVar10 + 1)) {
                                          process_opts_cold_5();
                                          return 1;
                                        }
                                        iVar3 = add_string(&opts->flist,argv[(int)(uVar10 + 1)]);
                                        if (iVar3 != 0) {
                                          return -1;
                                        }
                                        uVar10 = uVar10 + 2;
                                        if (argc <= (int)uVar10) {
                                          process_opts_cold_6();
                                          return 1;
                                        }
                                        iVar3 = add_string(&opts->vlist,argv[(int)uVar10]);
                                        if (iVar3 != 0) {
                                          return -1;
                                        }
                                      }
                                      else {
                                        iVar3 = strncmp((char *)__s1,"-mod_hdr",7);
                                        if (iVar3 == 0) {
                                          opts->mod_hdr = 1;
                                        }
                                        else {
                                          iVar3 = strncmp((char *)__s1,"-mod_nim",7);
                                          if (iVar3 == 0) {
                                            opts->mod_nim = 1;
                                          }
                                          else {
                                            iVar3 = strncmp((char *)__s1,"-keep_hist",5);
                                            if (iVar3 == 0) {
                                              opts->keep_hist = 1;
                                            }
                                            else {
                                              iVar3 = strncmp((char *)__s1,"-new_dim",8);
                                              if (iVar3 == 0) {
                                                uVar8 = 0;
                                                do {
                                                  if ((long)uVar2 <= (long)(lVar7 + 1 + uVar8)) {
                                                    process_opts_cold_4();
                                                    return 1;
                                                  }
                                                  ppuVar5 = __ctype_b_loc();
                                                  pcVar6 = argv[lVar7 + uVar8 + 1];
                                                  if (((*(byte *)((long)*ppuVar5 +
                                                                 (long)*pcVar6 * 2 + 1) & 8) == 0)
                                                     && (((*pcVar6 != '-' || (pcVar6[1] != '1')) ||
                                                         (pcVar6[2] != '\0')))) {
                                                    pcVar6 = 
                                                  "** -new_dim param %d (= \'%s\') is not a valid\n   consider: \'nifti_tool -help\'\n"
                                                  ;
LAB_001076f9:
                                                  fprintf(_stderr,pcVar6,uVar8 & 0xffffffff);
                                                  return -1;
                                                  }
                                                  iVar3 = atoi(pcVar6);
                                                  opts->new_dim[uVar8] = iVar3;
                                                  uVar8 = uVar8 + 1;
                                                } while (uVar8 != 8);
                                                uVar10 = uVar10 + 8;
                                              }
                                              else {
                                                iVar3 = strncmp((char *)__s1,"-new_datatype",10);
                                                if (iVar3 == 0) {
                                                  uVar10 = uVar10 + 1;
                                                  if (argc <= (int)uVar10) {
                                                    process_opts_cold_3();
                                                    return 1;
                                                  }
                                                  iVar3 = atoi(argv[(int)uVar10]);
                                                  opts->new_datatype = iVar3;
                                                }
                                                else {
                                                  iVar3 = strncmp((char *)__s1,"-overwrite",6);
                                                  if (iVar3 == 0) {
                                                    opts->overwrite = 1;
                                                  }
                                                  else {
                                                    iVar3 = strncmp((char *)__s1,"-prefix",4);
                                                    if (iVar3 == 0) {
                                                      uVar10 = uVar10 + 1;
                                                      if (argc <= (int)uVar10) {
                                                        process_opts_cold_2();
                                                        return 1;
                                                      }
                                                      opts->prefix = argv[(int)uVar10];
                                                    }
                                                    else if (((cVar1 == '-') &&
                                                             (*(char *)((long)&__s1->check_hdr + 1)
                                                              == 'q')) &&
                                                            (*(char *)((long)&__s1->check_hdr + 2)
                                                             == 'u')) {
                                                      opts->debug = 0;
                                                    }
                                                    else {
                                                      iVar3 = strncmp((char *)__s1,"-rm_ext",7);
                                                      if (iVar3 == 0) {
                                                        uVar10 = uVar10 + 1;
                                                        if (argc <= (int)uVar10) {
                                                          process_opts_cold_1();
                                                          return 1;
                                                        }
                                                        __s1 = (nt_opts *)argv[(int)uVar10];
                                                        iVar3 = strcmp((char *)__s1,"ALL");
                                                        if (iVar3 == 0) {
                                                          __s1 = (nt_opts *)0x1290c3;
                                                        }
                                                        else {
                                                          iVar3 = atoi((char *)__s1);
                                                          if ((iVar3 != -1) &&
                                                             ((1000 < iVar3 ||
                                                              (ppuVar5 = __ctype_b_loc(),
                                                              (*(byte *)((long)*ppuVar5 +
                                                                        (long)(char)__s1->check_hdr
                                                                        * 2 + 1) & 8) == 0)))) {
                                                            pcVar6 = 
                                                  "** \'-rm_ext\' requires an extension index (read \'%s\')\n"
                                                  ;
LAB_00107814:
                                                  fprintf(_stderr,pcVar6,__s1);
                                                  return -1;
                                                  }
                                                  }
                                                  iVar3 = add_string(slist,(char *)__s1);
                                                  if (iVar3 != 0) {
                                                    return -1;
                                                  }
                                                  opts->rm_exts = 1;
                                                  }
                                                  else {
                                                    iVar3 = strncmp((char *)__s1,"-strip_extras",6);
                                                    if (iVar3 == 0) {
                                                      opts->strip = 1;
                                                    }
                                                    else {
                                                      iVar3 = strncmp((char *)__s1,
                                                                      "-swap_as_analyze",0xc);
                                                      if (iVar3 == 0) {
                                                        opts->swap_ana = 1;
                                                      }
                                                      else {
                                                        iVar3 = strncmp((char *)__s1,
                                                                        "-swap_as_nifti",0xc);
                                                        if (iVar3 == 0) {
                                                          opts->swap_hdr = 1;
                                                        }
                                                        else {
                                                          iVar3 = strncmp((char *)__s1,
                                                                          "-swap_as_old",0xc);
                                                          if (iVar3 != 0) {
                                                            pcVar6 = "** unknown option: \'%s\'\n";
                                                            goto LAB_00107814;
                                                          }
                                                          opts->swap_old = 1;
                                                        }
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      uVar10 = uVar10 + 1;
      if (argc <= (int)uVar10) {
        if (opts->make_im != 0) {
          if (0 < slist_00->len) {
            process_opts_cold_14();
            return -1;
          }
          opts->cbl = 1;
          iVar3 = add_string(slist_00,"MAKE_IM");
          if (iVar3 != 0) {
            return -1;
          }
        }
        if ((opts->add_exts != 0) && (slist->len != (opts->etypes).len)) {
          fprintf(_stderr,"** ext list length (%d) != etype length (%d)\n");
          return -1;
        }
        g_debug = opts->debug;
        nifti_set_debug_level(g_debug);
        fill_cmd_string(opts,argc,argv);
        if (2 < g_debug) {
          disp_nt_opts("options read: ",opts);
          return 0;
        }
        return 0;
      }
    } while( true );
  }
  use_full((char *)prog);
  return 1;
}

Assistant:

int process_opts( int argc, char * argv[], nt_opts * opts )
{
   int ac;

   memset(opts, 0, sizeof(*opts));

   opts->prefix = NULL;
   opts->debug = 1;  /* init debug level to basic output */

   /* init options for creating a new dataset via "MAKE_IM" */
   opts->new_datatype = NIFTI_TYPE_INT16;
   opts->new_dim[0] = 3;
   opts->new_dim[1] = 1;  opts->new_dim[2] = 1;  opts->new_dim[3] = 1;

   if( argc < 2 ) return usage(argv[0], USE_FULL);

   /* terminal options are first, the rest are sorted */
   for( ac = 1; ac < argc; ac++ )
   {
      if( ! strncmp(argv[ac], "-help_datatypes", 9) )
      {
         ac++;
         if( ac >= argc )
            nifti_disp_type_list(3);  /* show all types */
         else if( argv[ac][0] == 'd' || argv[ac][0] == 'D' )
            nifti_disp_type_list(1);  /* show DT_* types */
         else if( argv[ac][0] == 't' || argv[ac][0] == 'T' )
            nifti_test_datatype_sizes(1); /* test each nbyper and swapsize */
         else
            nifti_disp_type_list(2);  /* show NIFTI_* types */
         return 1;
      }
      else if( ! strncmp(argv[ac], "-help_hdr", 9) )
         return usage(argv[0], USE_FIELD_HDR);
      else if( ! strncmp(argv[ac], "-help_nim", 9) )
         return usage(argv[0], USE_FIELD_NIM);
      else if( ! strncmp(argv[ac], "-help_ana", 9) )
         return usage(argv[0], USE_FIELD_ANA);
      else if( ! strncmp(argv[ac], "-help", 5) )
         return usage(argv[0], USE_FULL);
      else if( ! strncmp(argv[ac], "-hist", 5) )
         return usage(argv[0], USE_HIST);
      else if( ! strncmp(argv[ac], "-ver", 2) )
         return usage(argv[0], USE_VERSION);
      else if( ! strncmp(argv[ac], "-nifti_hist", 11) )
      {
         nifti_disp_lib_hist();
         return 1;
      }
      else if( ! strncmp(argv[ac], "-nifti_ver", 10) )
      {
         nifti_disp_lib_version();
         return 1;
      }
      else if( ! strncmp(argv[ac], "-with_zlib", 5) ) {
         printf("Was NIfTI library compiled with zlib?  %s\n",
                nifti_compiled_with_zlib() ? "YES" : "NO");
         return 1;
      }

      /* begin normal execution options... */
      else if( ! strncmp(argv[ac], "-add_afni_ext", 9) )
      {
         ac++;
         CHECK_NEXT_OPT(ac, argc, "-add_afni_ext");
         if( add_string(&opts->elist, argv[ac]) ) return -1; /* add extension */
         if( add_int(&opts->etypes, NIFTI_ECODE_AFNI) ) return -1;
         opts->add_exts = 1;
      }
      else if( ! strncmp(argv[ac], "-add_comment_ext", 9) )
      {
         ac++;
         CHECK_NEXT_OPT(ac, argc, "-add_comment_ext");
         if( add_string(&opts->elist, argv[ac]) ) return -1; /* add extension */
         if( add_int(&opts->etypes, NIFTI_ECODE_COMMENT) ) return -1;
         opts->add_exts = 1;
      }
      else if( ! strncmp(argv[ac], "-check_hdr", 10) )
         opts->check_hdr = 1;
      else if( ! strncmp(argv[ac], "-check_nim", 10) )
         opts->check_nim = 1;
      else if( ! strncmp(argv[ac], "-copy_brick_list", 11) ||
               ! strncmp(argv[ac], "-copy_im", 10) ||
               ! strncmp(argv[ac], "-cbl", 4) )
      {
         opts->cbl = 1;
      }
      else if( ! strncmp(argv[ac], "-copy_collapsed_image", 10) ||
               ! strncmp(argv[ac], "-cci", 4) )
      {
         /* we need to read in the 7 dimension values */
         int index;
         opts->ci_dims[0] = 0;
         for( index = 1; index < 8; index++ )
         {
            ac++;
            CHECK_NEXT_OPT_MSG(ac,argc,"-cci","7 dimension values are requred");
            if( ! isdigit(argv[ac][0]) && strcmp(argv[ac],"-1") ){
               fprintf(stderr,"** -cci param %d (= '%s') is not a valid\n"
                       "   consider: 'nifti_tool -help'\n",index,argv[ac]);
               return -1;
            }
            opts->ci_dims[index] = atoi(argv[ac]);
         }

         opts->cci = 1;
      }
      else if( ! strncmp(argv[ac], "-debug", 6) )
      {
         ac++;
         CHECK_NEXT_OPT(ac, argc, "-debug");
         opts->debug = atoi(argv[ac]);
      }
      else if( ! strncmp(argv[ac], "-diff_hdr", 8) )
         opts->diff_hdr = 1;
      else if( ! strncmp(argv[ac], "-diff_nim", 8) )
         opts->diff_nim = 1;
      else if( ! strncmp(argv[ac], "-disp_exts", 7) )
         opts->disp_exts = 1;
      else if( ! strncmp(argv[ac], "-disp_hdr", 8) )
         opts->disp_hdr = 1;
      else if( ! strncmp(argv[ac], "-disp_nim", 8) )
         opts->disp_nim = 1;
      else if( ! strncmp(argv[ac], "-disp_ana", 8) )
         opts->disp_ana = 1;
      else if( ! strncmp(argv[ac], "-dci_lines", 6) ||   /* before -dts */
               ! strncmp(argv[ac], "-dts_lines", 6) )
      {
         opts->dci_lines = 1;
      }
      else if( ! strncmp(argv[ac], "-disp_collapsed_image", 10) ||
               ! strncmp(argv[ac], "-disp_ci", 8) )
      {
         /* we need to read in the 7 dimension values */
         int index;
         opts->ci_dims[0] = 0;
         for( index = 1; index < 8; index++ )
         {
            ac++;
            CHECK_NEXT_OPT_MSG(ac,argc,"-disp_ci",
                               "7 dimension values are requred");
            if( ! isdigit(argv[ac][0]) && strcmp(argv[ac],"-1") ){
               fprintf(stderr,"** -disp_ci param %d (= '%s') is not a valid\n"
                       "   consider: 'nifti_tool -help'\n",index,argv[ac]);
               return -1;
            }
            opts->ci_dims[index] = atoi(argv[ac]);
         }

         opts->dci = 1;
      }
      else if( ! strncmp(argv[ac], "-disp_ts", 10) ||
               ! strncmp(argv[ac], "-dts", 4) )
      {
         /* we need to read in the ijk indices into the ci_dims array */
         int index;
         for( index = 1; index <= 3; index++ )
         {
            ac++;
            CHECK_NEXT_OPT_MSG(ac,argc,"-dts","i,j,k indices are requied\n");
            if( ! isdigit(argv[ac][0]) ){
               fprintf(stderr,"** -dts param %d (= '%s') is not a number\n"
                       "   consider: 'nifti_tool -help'\n",index,argv[ac]);
               return -1;
            }
            opts->ci_dims[index] = atoi(argv[ac]);
         }
         /* and fill the rest of the array */
         opts->ci_dims[0] = 0;
         for( index = 4; index < 8; index++ ) opts->ci_dims[index] = -1;

         opts->dts = 1;
      }
      else if( ! strncmp(argv[ac], "-field", 2) )
      {
         ac++;
         CHECK_NEXT_OPT(ac, argc, "-field");
         if( add_string(&opts->flist, argv[ac]) ) return -1; /* add field */
      }
      else if( ! strncmp(argv[ac], "-infiles", 3) )
      {
         int count;
         /* for -infiles, get all next arguments until a '-' or done */
         ac++;
         for( count = 0; (ac < argc) && (argv[ac][0] != '-'); ac++, count++ )
            if( add_string(&opts->infiles, argv[ac]) ) return -1;/* add field */
         if( count > 0 && ac < argc ) ac--;  /* more options to process */
         if( g_debug > 2 ) fprintf(stderr,"+d have %d file names\n", count);
      }
      else if( ! strncmp(argv[ac], "-make_image", 8) )
      {
         opts->make_im = 1;  /* will setup later, as -cbl and MAKE_IM */
      }
      else if( ! strncmp(argv[ac], "-mod_field", 6) )
      {
         ac++;
         CHECK_NEXT_OPT(ac, argc, "-mod_field");
         if( add_string(&opts->flist, argv[ac]) ) return -1; /* add field */
         ac++;
         CHECK_NEXT_OPT(ac, argc, "-mod_field (2)");
         if( add_string(&opts->vlist, argv[ac]) ) return -1; /* add value */
      }
      else if( ! strncmp(argv[ac], "-mod_hdr", 7) )
         opts->mod_hdr = 1;
      else if( ! strncmp(argv[ac], "-mod_nim", 7) )
         opts->mod_nim = 1;
      else if( ! strncmp(argv[ac], "-keep_hist", 5) )
         opts->keep_hist = 1;
      else if( ! strncmp(argv[ac], "-new_dim", 8) )
      {
         /* we need to read in the 8 dimension values */
         int index;
         for( index = 0; index < 8; index++ )
         {
            ac++;
            CHECK_NEXT_OPT_MSG(ac,argc,"-new_dim","8 dim values are requred");
            if( ! isdigit(argv[ac][0]) && strcmp(argv[ac],"-1") ){
               fprintf(stderr,"** -new_dim param %d (= '%s') is not a valid\n"
                       "   consider: 'nifti_tool -help'\n",index,argv[ac]);
               return -1;
            }
            opts->new_dim[index] = atoi(argv[ac]);
         }
      }
      else if( ! strncmp(argv[ac], "-new_datatype", 10) )
      {
         ac++;
         CHECK_NEXT_OPT(ac, argc, "-new_datatype");
         opts->new_datatype = atoi(argv[ac]);
      }
      else if( ! strncmp(argv[ac], "-overwrite", 6) )
         opts->overwrite = 1;
      else if( ! strncmp(argv[ac], "-prefix", 4) )
      {
         ac++;
         CHECK_NEXT_OPT(ac, argc, "-prefix");
         opts->prefix = argv[ac];
      }
      else if( ! strncmp(argv[ac], "-quiet", 3) )
         opts->debug = 0;
      else if( ! strncmp(argv[ac], "-rm_ext", 7) )
      {
         ac++;
         CHECK_NEXT_OPT(ac, argc, "-rm_ext");
         if( strcmp(argv[ac],"ALL") == 0 )  /* special case, pass -1 */
         {
            if( add_string(&opts->elist, "-1") ) return -1;
         }
         else
         {
            int index = atoi(argv[ac]);
            if( (index != -1) && ((index > 1000) || !isdigit(*argv[ac])) ){
               fprintf(stderr,
                    "** '-rm_ext' requires an extension index (read '%s')\n",
                    argv[ac]);
               return -1;
            }
            if( add_string(&opts->elist, argv[ac]) ) return -1;
         }
         opts->rm_exts = 1;
      }
      else if( ! strncmp(argv[ac], "-strip_extras", 6) )
         opts->strip = 1;
      else if( ! strncmp(argv[ac], "-swap_as_analyze", 12) )
         opts->swap_ana = 1;
      else if( ! strncmp(argv[ac], "-swap_as_nifti", 12) )
         opts->swap_hdr = 1;
      else if( ! strncmp(argv[ac], "-swap_as_old", 12) )
         opts->swap_old = 1;
      else
      {
         fprintf(stderr,"** unknown option: '%s'\n", argv[ac]);
         return -1;
      }
   }

   if( opts->make_im )
   {
      if( opts->infiles.len > 0 )
      {
         fprintf(stderr,"** -infiles is invalid when using -make_im\n");
         return -1;
      }
      /* apply -make_im via -cbl and "MAKE_IM" */
      opts->cbl = 1;
      if( add_string(&opts->infiles, NT_MAKE_IM_NAME) ) return -1;
   }

   /* verify for programming purposes */
   if( opts->add_exts && ( opts->elist.len != opts->etypes.len ) )
   {
      fprintf(stderr,"** ext list length (%d) != etype length (%d)\n",
              opts->elist.len, opts->etypes.len);
      return -1;
   }

   g_debug = opts->debug;
   nifti_set_debug_level(g_debug);

   fill_cmd_string(opts, argc, argv);  /* copy this command */

   if( g_debug > 2 ) disp_nt_opts("options read: ", opts);

   return 0;
}